

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

bool re2::IsAnchorStart(Regexp **pre,int depth)

{
  uint8 uVar1;
  ushort uVar2;
  bool bVar3;
  Regexp *in_RAX;
  Regexp **sub_00;
  ulong uVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  Regexp *this;
  ulong uVar7;
  Regexp *sub;
  Regexp *local_38;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) {
    return false;
  }
  uVar1 = this->op_;
  if (uVar1 == '\x12') {
    local_38 = in_RAX;
    pRVar5 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_0011d905:
    *pre = pRVar5;
LAB_0011d908:
    bVar3 = true;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar6 = &this->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar6->subone_);
      bVar3 = IsAnchorStart(&local_38,depth + 1);
      if (bVar3) {
        if (this->op_ != '\v') {
          __assert_fail("(op_) == (kRegexpCapture)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h"
                        ,0x14b,"int re2::Regexp::cap()");
        }
        pRVar5 = Regexp::Capture(local_38,(uint)this->parse_flags_,(this->field_7).field_0.max_);
        goto LAB_0011d905;
      }
    }
    else {
      if (uVar1 != '\x05') {
        return false;
      }
      if (this->nsub_ == 0) {
        return false;
      }
      paVar6 = &this->field_5;
      if (this->nsub_ != 1) {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      local_38 = Regexp::Incref(paVar6->subone_);
      bVar3 = IsAnchorStart(&local_38,depth + 1);
      if (bVar3) {
        sub_00 = (Regexp **)operator_new__((ulong)this->nsub_ << 3);
        *sub_00 = local_38;
        uVar2 = this->nsub_;
        uVar4 = (ulong)uVar2;
        if (1 < uVar2) {
          uVar7 = 1;
          do {
            paVar6 = &this->field_5;
            if (1 < (ushort)uVar4) {
              paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
            }
            pRVar5 = Regexp::Incref(paVar6[uVar7].subone_);
            sub_00[uVar7] = pRVar5;
            uVar7 = uVar7 + 1;
            uVar2 = this->nsub_;
            uVar4 = (ulong)uVar2;
          } while (uVar7 < uVar4);
        }
        pRVar5 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
        *pre = pRVar5;
        operator_delete__(sub_00);
        goto LAB_0011d908;
      }
    }
    bVar3 = false;
    this = local_38;
  }
  Regexp::Decref(this);
  return bVar3;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}